

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void set_txfm_ctxs(TX_SIZE tx_size,int n4_w,int n4_h,int skip,MACROBLOCKD *xd)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte in_DIL;
  long in_R8;
  uint8_t bh;
  uint8_t bw;
  uint8_t local_1a;
  uint8_t local_19;
  
  local_19 = (uint8_t)tx_size_wide[in_DIL];
  local_1a = (uint8_t)tx_size_high[in_DIL];
  if (in_ECX != 0) {
    local_19 = (uint8_t)(in_ESI << 2);
    local_1a = (uint8_t)(in_EDX << 2);
  }
  set_txfm_ctx(*(TXFM_CONTEXT **)(in_R8 + 0x1fc0),local_19,in_ESI);
  set_txfm_ctx(*(TXFM_CONTEXT **)(in_R8 + 0x1fc8),local_1a,in_EDX);
  return;
}

Assistant:

static inline void set_txfm_ctxs(TX_SIZE tx_size, int n4_w, int n4_h, int skip,
                                 const MACROBLOCKD *xd) {
  uint8_t bw = tx_size_wide[tx_size];
  uint8_t bh = tx_size_high[tx_size];

  if (skip) {
    bw = n4_w * MI_SIZE;
    bh = n4_h * MI_SIZE;
  }

  set_txfm_ctx(xd->above_txfm_context, bw, n4_w);
  set_txfm_ctx(xd->left_txfm_context, bh, n4_h);
}